

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O0

JointAction * __thiscall
MADPComponentDiscreteActions::GetJointAction(MADPComponentDiscreteActions *this,Index i)

{
  ostream *poVar1;
  undefined8 uVar2;
  size_type sVar3;
  const_reference ppJVar4;
  E *this_00;
  stringstream *arg;
  uint in_ESI;
  long in_RDI;
  stringstream ss;
  stringstream ss_1;
  stringstream *in_stack_fffffffffffffc88;
  E *in_stack_fffffffffffffc90;
  char *in_stack_fffffffffffffcb8;
  E *in_stack_fffffffffffffcc0;
  stringstream local_330 [16];
  ostream local_320 [392];
  stringstream local_198 [16];
  ostream local_188 [380];
  uint local_c;
  
  local_c = in_ESI;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = std::operator<<(local_188,"MADPComponentDiscreteActions::GetJointAction(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
    poVar1 = std::operator<<(poVar1,") - Error: not initialized. ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  if ((*(byte *)(in_RDI + 9) & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    __cxa_throw(uVar2,&E::typeinfo,E::~E);
  }
  sVar3 = std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::size
                    ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)
                     (in_RDI + 0x20));
  if (in_ESI < sVar3) {
    ppJVar4 = std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::operator[]
                        ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)
                         (in_RDI + 0x20),(ulong)local_c);
    return &(*ppJVar4)->super_JointAction;
  }
  std::__cxx11::stringstream::stringstream(local_330);
  this_00 = (E *)std::operator<<(local_320,
                                 "WARNING MADPComponentDiscreteActions::GetJointAction(Index i) index a out of bounds"
                                );
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  arg = (stringstream *)__cxa_allocate_exception(0x28);
  E::E(this_00,arg);
  __cxa_throw(arg,&E::typeinfo,E::~E);
}

Assistant:

const JointAction* MADPComponentDiscreteActions::GetJointAction(Index i) const
{
    if(!_m_initialized)
    {
        stringstream ss;
            ss << "MADPComponentDiscreteActions::GetJointAction("<< 
            i<<") - Error: not initialized. "<<endl;
            throw E(ss);
    }
    if(!_m_cachedAllJointActions)
    {
        throw E("MADPComponentDiscreteActions::GetJointActionDiscrete: joint actions have not been created");
    }
    if(i < _m_jointActionVec.size() )
        return( (const JointAction*) _m_jointActionVec[i] );
    //else        
    stringstream ss;
    ss << "WARNING MADPComponentDiscreteActions::GetJointAction(Index i) index a out of bounds"<<endl;
    throw E(ss);
}